

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack30_24(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar13 [32];
  
  auVar11 = *(undefined1 (*) [32])(in + 1);
  uVar2 = *in;
  auVar9 = *(undefined1 (*) [16])(in + 5);
  auVar1 = *(undefined1 (*) [16])(in + 0x10);
  auVar6 = vpmovsxbd_avx(ZEXT416(0x2010004));
  uVar3 = in[0xf];
  uVar4 = *(ulong *)(in + 0x14);
  *out = uVar2 & 0x3fffffff;
  uVar5 = *(ulong *)(in + 0xd);
  auVar10 = valignd_avx512vl(auVar11,auVar11,7);
  auVar7 = vpermi2d_avx512vl(auVar6,auVar1,ZEXT416(uVar3));
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar4;
  auVar6 = vpalignr_avx(auVar15,auVar1,0xc);
  auVar13 = vpblendd_avx2(auVar10,ZEXT432(uVar2),1);
  auVar10 = vpmovsxbd_avx2(ZEXT816(0x100e0c0a08060402));
  auVar11 = vpshldvd_avx512_vbmi2(auVar11,auVar13,auVar10);
  auVar12._8_4_ = 0x3fffffff;
  auVar12._0_8_ = 0x3fffffff3fffffff;
  auVar12._12_4_ = 0x3fffffff;
  auVar13._16_4_ = 0x3fffffff;
  auVar13._0_16_ = auVar12;
  auVar13._20_4_ = 0x3fffffff;
  auVar13._24_4_ = 0x3fffffff;
  auVar13._28_4_ = 0x3fffffff;
  auVar8 = vpshldvd_avx512_vbmi2(auVar1,auVar7,auVar10._0_16_);
  auVar11 = vpand_avx2(auVar11,auVar13);
  *(undefined1 (*) [32])(out + 1) = auVar11;
  auVar1 = *(undefined1 (*) [16])(in + 9);
  auVar9 = vpalignr_avx(auVar1,auVar9,0xc);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar5;
  auVar7 = vpalignr_avx(auVar14,auVar1,0xc);
  auVar14 = vpsllvd_avx2(auVar14,_DAT_00199ae0);
  auVar9 = vpshldvd_avx512_vbmi2(auVar1,auVar9,_DAT_00197360);
  auVar9 = vpand_avx(auVar9,auVar12);
  auVar1 = vpand_avx(auVar8,auVar12);
  *(undefined1 (*) [16])(out + 9) = auVar9;
  auVar9 = vpsrlvd_avx2(auVar7,_DAT_00197750);
  auVar7._8_8_ = 0x300000003c000000;
  auVar7._0_8_ = 0x300000003c000000;
  auVar7 = vpternlogq_avx512vl(auVar14,auVar9,auVar7,0xec);
  auVar9 = vpsllvd_avx2(auVar15,_DAT_0019a150);
  *(long *)(out + 0xd) = auVar7._0_8_;
  auVar6 = vpsrlvd_avx2(auVar6,_DAT_001991c0);
  out[0xf] = (uint)(uVar5 >> 0x22);
  uVar2 = in[0x16];
  out[0x10] = uVar3 & 0x3fffffff;
  *(undefined1 (*) [16])(out + 0x11) = auVar1;
  auVar1._8_8_ = 0x3ffff0003ffffc00;
  auVar1._0_8_ = 0x3ffff0003ffffc00;
  auVar9 = vpternlogq_avx512vl(auVar9,auVar6,auVar1,0xec);
  *(long *)(out + 0x15) = auVar9._0_8_;
  out[0x17] = (uVar2 & 0xffff) << 0xe | (uint)(uVar4 >> 0x32);
  return in + 0x17;
}

Assistant:

const uint32_t *__fastunpack30_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 28)) << (30 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 26)) << (30 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 24)) << (30 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 22)) << (30 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 20)) << (30 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 18)) << (30 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 16)) << (30 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 14)) << (30 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 12)) << (30 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 10)) << (30 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 8)) << (30 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 6)) << (30 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  *out |= ((*in) % (1U << 4)) << (30 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  *out |= ((*in) % (1U << 2)) << (30 - 2);
  out++;
  *out = ((*in) >> 2);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 28)) << (30 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 26)) << (30 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 24)) << (30 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 22)) << (30 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 20)) << (30 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 18)) << (30 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 16)) << (30 - 16);
  out++;

  return in + 1;
}